

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O3

void test_angular_quadrature<IntegratorXX::LebedevLaikov<double>>
               (string *msg,LebedevLaikov<double> *quad,int maxL,double e)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong uVar7;
  ulong *puVar8;
  long *plVar9;
  uint uVar10;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> loc_msg;
  uint local_158;
  uint local_154;
  ulong *local_150;
  long local_148;
  ulong local_140 [2];
  int local_12c;
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  ulong *local_108;
  long local_100;
  ulong local_f8 [2];
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  LebedevLaikov<double> *local_68;
  double local_60;
  string *local_58;
  string local_50;
  
  local_154 = 1;
  if (1 < maxL) {
    local_12c = maxL;
    local_68 = quad;
    local_60 = e;
    local_58 = msg;
    do {
      local_158 = 0;
      if (-1 < (int)local_154) {
        do {
          local_150 = local_140;
          pcVar1 = (local_58->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,pcVar1,pcVar1 + local_58->_M_string_length);
          std::__cxx11::string::append((char *)&local_150);
          uVar3 = -local_154;
          if (0 < (int)local_154) {
            uVar3 = local_154;
          }
          uVar11 = 1;
          if (9 < uVar3) {
            uVar7 = (ulong)uVar3;
            uVar10 = 4;
            do {
              uVar11 = uVar10;
              uVar4 = (uint)uVar7;
              if (uVar4 < 100) {
                uVar11 = uVar11 - 2;
                goto LAB_0011ae61;
              }
              if (uVar4 < 1000) {
                uVar11 = uVar11 - 1;
                goto LAB_0011ae61;
              }
              if (uVar4 < 10000) goto LAB_0011ae61;
              uVar7 = uVar7 / 10000;
              uVar10 = uVar11 + 4;
            } while (99999 < uVar4);
            uVar11 = uVar11 + 1;
          }
LAB_0011ae61:
          uVar10 = local_154 >> 0x1f;
          local_108 = local_f8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_108,(char)uVar11 - (char)((int)local_154 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)uVar10 + (long)local_108),uVar11,uVar3);
          uVar7 = 0xf;
          if (local_150 != local_140) {
            uVar7 = local_140[0];
          }
          if (uVar7 < (ulong)(local_100 + local_148)) {
            uVar7 = 0xf;
            if (local_108 != local_f8) {
              uVar7 = local_f8[0];
            }
            if (uVar7 < (ulong)(local_100 + local_148)) goto LAB_0011aee3;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_150)
            ;
          }
          else {
LAB_0011aee3:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_108);
          }
          plVar6 = puVar5 + 2;
          if ((long *)*puVar5 == plVar6) {
            local_d8 = *plVar6;
            uStack_d0 = puVar5[3];
            local_e8 = &local_d8;
          }
          else {
            local_d8 = *plVar6;
            local_e8 = (long *)*puVar5;
          }
          local_e0 = puVar5[1];
          *puVar5 = plVar6;
          puVar5[1] = 0;
          *(undefined1 *)plVar6 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
          puVar8 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar8) {
            local_98 = *puVar8;
            lStack_90 = plVar6[3];
            local_a8 = &local_98;
          }
          else {
            local_98 = *puVar8;
            local_a8 = (ulong *)*plVar6;
          }
          local_a0 = plVar6[1];
          *plVar6 = (long)puVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          uVar3 = -local_158;
          if (0 < (int)local_158) {
            uVar3 = local_158;
          }
          uVar11 = 1;
          if (9 < uVar3) {
            uVar7 = (ulong)uVar3;
            uVar10 = 4;
            do {
              uVar11 = uVar10;
              uVar4 = (uint)uVar7;
              if (uVar4 < 100) {
                uVar11 = uVar11 - 2;
                goto LAB_0011affd;
              }
              if (uVar4 < 1000) {
                uVar11 = uVar11 - 1;
                goto LAB_0011affd;
              }
              if (uVar4 < 10000) goto LAB_0011affd;
              uVar7 = uVar7 / 10000;
              uVar10 = uVar11 + 4;
            } while (99999 < uVar4);
            uVar11 = uVar11 + 1;
          }
LAB_0011affd:
          uVar10 = local_158 >> 0x1f;
          local_128 = local_118;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_128,(char)uVar11 - (char)((int)local_158 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)uVar10 + (long)local_128),uVar11,uVar3);
          uVar7 = 0xf;
          if (local_a8 != &local_98) {
            uVar7 = local_98;
          }
          if (uVar7 < (ulong)(local_120 + local_a0)) {
            uVar7 = 0xf;
            if (local_128 != local_118) {
              uVar7 = local_118[0];
            }
            if (uVar7 < (ulong)(local_120 + local_a0)) goto LAB_0011b093;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_a8);
          }
          else {
LAB_0011b093:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_128);
          }
          plVar6 = puVar5 + 2;
          if ((long *)*puVar5 == plVar6) {
            local_b8 = *plVar6;
            uStack_b0 = puVar5[3];
            local_c8 = &local_b8;
          }
          else {
            local_b8 = *plVar6;
            local_c8 = (long *)*puVar5;
          }
          local_c0 = puVar5[1];
          *puVar5 = plVar6;
          puVar5[1] = 0;
          *(undefined1 *)plVar6 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_78 = *plVar9;
            lStack_70 = plVar6[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *plVar9;
            local_88 = (long *)*plVar6;
          }
          local_80 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,local_b8 + 1);
          }
          if (local_128 != local_118) {
            operator_delete(local_128,local_118[0] + 1);
          }
          if (local_a8 != &local_98) {
            operator_delete(local_a8,local_98 + 1);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          if (local_108 != local_f8) {
            operator_delete(local_108,local_f8[0] + 1);
          }
          if (local_150 != local_140) {
            operator_delete(local_150,local_140[0] + 1);
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_88,local_80 + (long)local_88);
          test_quadrature<MagnitudeSquaredSphericalHarmonic,IntegratorXX::LebedevLaikov<double>,int&,int&>
                    (&local_50,local_68,1.0,local_60,(int *)&local_154,(int *)&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_88 != &local_78) {
            operator_delete(local_88,local_78 + 1);
          }
          bVar2 = (int)local_158 < (int)local_154;
          local_158 = local_158 + 1;
        } while (bVar2);
      }
      local_154 = local_154 + 1;
    } while ((int)local_154 < local_12c);
  }
  return;
}

Assistant:

void test_angular_quadrature(std::string msg, const QuadType& quad, int maxL, double e) {

  for( auto l = 1; l < maxL; ++l )
  for( auto m = 0; m <= l; ++m ) {
    auto loc_msg = msg + "(L,M) = (" + std::to_string(l) + "," + std::to_string(m) + ")";
    test_quadrature<MagnitudeSquaredSphericalHarmonic>(loc_msg, quad, 1.0, e, l, m); 
  }

}